

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiOldColumns *pIVar1;
  float fVar2;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 == (ImGuiOldColumns *)0x0) {
    fVar2 = 0.0;
  }
  else {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    if ((pIVar1->Columns).Size <= column_index) {
      __assert_fail("column_index < columns->Columns.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0xe58,"float ImGui::GetColumnOffset(int)");
    }
    if (column_index < 0) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,
                    "T &ImVector<ImGuiOldColumnData>::operator[](int) [T = ImGuiOldColumnData]");
    }
    fVar2 = (pIVar1->OffMaxX - pIVar1->OffMinX) *
            (pIVar1->Columns).Data[(uint)column_index].OffsetNorm + pIVar1->OffMinX;
  }
  return fVar2;
}

Assistant:

float ImGui::GetColumnOffset(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return 0.0f;

    if (column_index < 0)
        column_index = columns->Current;
    IM_ASSERT(column_index < columns->Columns.Size);

    const float t = columns->Columns[column_index].OffsetNorm;
    const float x_offset = ImLerp(columns->OffMinX, columns->OffMaxX, t);
    return x_offset;
}